

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_node_check_syntax(lys_node *node)

{
  LYS_NODE LVar1;
  int iVar2;
  lyxp_expr *plVar3;
  char *pcVar4;
  lyxp_expr *expr;
  lys_restr *must;
  lys_when *when;
  uint32_t i;
  uint16_t exp_idx;
  uint8_t must_size;
  lys_node *node_local;
  
  when._7_1_ = 0;
  must = (lys_restr *)0x0;
  expr = (lyxp_expr *)0x0;
  LVar1 = node->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    must = (lys_restr *)node[1].name;
    expr = (lyxp_expr *)node[1].dsc;
    when._7_1_ = node->padding[2];
  }
  else if (LVar1 == LYS_CHOICE) {
    must = (lys_restr *)node[1].name;
  }
  else if (LVar1 == LYS_LEAF) {
    must = (lys_restr *)node[1].name;
    expr = (lyxp_expr *)node[1].dsc;
    when._7_1_ = node->padding[3];
  }
  else if (LVar1 == LYS_LEAFLIST) {
    must = (lys_restr *)node[1].name;
    expr = (lyxp_expr *)node[1].dsc;
    when._7_1_ = node->padding[3];
  }
  else if (LVar1 == LYS_LIST) {
    must = (lys_restr *)node[1].name;
    expr = (lyxp_expr *)node[1].dsc;
    when._7_1_ = node->padding[0];
  }
  else {
    if (LVar1 != LYS_ANYXML) {
      if (LVar1 == LYS_CASE) {
        must = (lys_restr *)node[1].name;
        goto LAB_00199069;
      }
      if (LVar1 == LYS_NOTIF) {
        expr = (lyxp_expr *)node[1].dsc;
        when._7_1_ = node->padding[3];
        goto LAB_00199069;
      }
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        expr = (lyxp_expr *)node[1].dsc;
        when._7_1_ = node->padding[3];
        goto LAB_00199069;
      }
      if (LVar1 == LYS_USES) {
        must = (lys_restr *)node[1].name;
        goto LAB_00199069;
      }
      if (LVar1 == LYS_AUGMENT) {
        must = (lys_restr *)node->next;
        goto LAB_00199069;
      }
      if (LVar1 != LYS_ANYDATA) goto LAB_00199069;
    }
    must = (lys_restr *)node[1].name;
    expr = (lyxp_expr *)node[1].dsc;
    when._7_1_ = node->padding[3];
  }
LAB_00199069:
  _i = node;
  if (must != (lys_restr *)0x0) {
    plVar3 = lyxp_parse_expr(must->expr);
    if (plVar3 == (lyxp_expr *)0x0) {
      return -1;
    }
    when._4_2_ = 0;
    iVar2 = reparse_expr(plVar3,(uint16_t *)((long)&when + 4));
    if (iVar2 != 0) {
      lyxp_expr_free(plVar3);
      return -1;
    }
    if (when._4_2_ != plVar3->used) {
      pcVar4 = print_token(plVar3->tokens[when._4_2_]);
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,
              plVar3->expr + plVar3->expr_pos[when._4_2_]);
      lyxp_expr_free(plVar3);
      return -1;
    }
    lyxp_expr_free(plVar3);
  }
  when._0_4_ = 0;
  while( true ) {
    if (when._7_1_ <= (uint)when) {
      return 0;
    }
    plVar3 = lyxp_parse_expr(*(char **)((long)expr + (ulong)(uint)when * 0x38));
    if (plVar3 == (lyxp_expr *)0x0) {
      return -1;
    }
    when._4_2_ = 0;
    iVar2 = reparse_expr(plVar3,(uint16_t *)((long)&when + 4));
    if (iVar2 != 0) {
      lyxp_expr_free(plVar3);
      return -1;
    }
    if (when._4_2_ != plVar3->used) break;
    lyxp_expr_free(plVar3);
    when._0_4_ = (uint)when + 1;
  }
  pcVar4 = print_token(plVar3->tokens[when._4_2_]);
  ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,
          plVar3->expr + plVar3->expr_pos[when._4_2_]);
  lyxp_expr_free(plVar3);
  return -1;
}

Assistant:

int
lyxp_node_check_syntax(const struct lys_node *node)
{
    uint8_t must_size = 0;
    uint16_t exp_idx;
    uint32_t i;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    struct lyxp_expr *expr;

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    /* check "when" */
    if (when) {
        expr = lyxp_parse_expr(when->cond);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_expr(expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        expr = lyxp_parse_expr(must[i].expr);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_expr(expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    return 0;
}